

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::MessageFormat::setFormat
          (MessageFormat *this,UnicodeString *formatName,Format *newFormat,UErrorCode *status)

{
  Part *pPVar1;
  char cVar2;
  int32_t iVar3;
  UErrorCode UVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  Part *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar3 = MessagePattern::validateArgumentName(formatName);
  UVar4 = U_ILLEGAL_ARGUMENT_ERROR;
  if (-2 < iVar3) {
    uVar10 = 0;
    while( true ) {
      do {
        pPVar1 = (this->msgPattern).parts;
        if ((int)uVar10 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = uVar10 & 0xffffffff;
          if ((int)uVar10 < pPVar1[uVar10 & 0xffffffff].limitPartIndex) {
            uVar8 = (ulong)(uint)pPVar1[uVar10 & 0xffffffff].limitPartIndex;
          }
        }
        pPVar7 = pPVar1 + uVar8;
        do {
          uVar9 = uVar8;
          pPVar7 = pPVar7 + 1;
          if (pPVar7->type == UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return;
          }
          uVar10 = uVar9 + 1;
          uVar8 = uVar10;
        } while (pPVar7->type != UMSGPAT_PART_TYPE_ARG_START);
        if (U_ZERO_ERROR < *status) {
          return;
        }
        uVar6 = (int)uVar9 + 2;
        if (pPVar1[uVar6].type == UMSGPAT_PART_TYPE_ARG_NAME) {
          cVar2 = MessagePattern::partSubstringMatches(&this->msgPattern,pPVar1 + uVar6,formatName);
        }
        else {
          cVar2 = iVar3 == pPVar1[uVar6].value;
        }
      } while (cVar2 == '\0');
      iVar5 = (*(newFormat->super_UObject)._vptr_UObject[4])(newFormat);
      if ((Format *)CONCAT44(extraout_var,iVar5) == (Format *)0x0) break;
      setCustomArgStartFormat(this,(int32_t)uVar10,(Format *)CONCAT44(extraout_var,iVar5),status);
    }
    UVar4 = U_MEMORY_ALLOCATION_ERROR;
  }
  *status = UVar4;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }